

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

TrackPosition * __thiscall mkvparser::CuePoint::Find(CuePoint *this,Track *pTrack)

{
  TrackPosition *pTVar1;
  TrackPosition *pTVar2;
  long lVar3;
  bool bVar4;
  
  if (pTrack != (Track *)0x0) {
    pTVar2 = this->m_track_positions;
    pTVar1 = (TrackPosition *)(this->m_track_positions_count * 8);
    lVar3 = this->m_track_positions_count * 0x18;
    while (lVar3 != 0) {
      lVar3 = lVar3 + -0x18;
      bVar4 = pTVar2->m_track == (pTrack->m_info).number;
      if (bVar4) {
        pTVar1 = pTVar2;
      }
      pTVar2 = pTVar2 + 1;
      if (bVar4) {
        return pTVar1;
      }
    }
  }
  return (TrackPosition *)0x0;
}

Assistant:

const CuePoint::TrackPosition* CuePoint::Find(const Track* pTrack) const {
  if (pTrack == NULL) {
    return NULL;
  }

  const long long n = pTrack->GetNumber();

  const TrackPosition* i = m_track_positions;
  const TrackPosition* const j = i + m_track_positions_count;

  while (i != j) {
    const TrackPosition& p = *i++;

    if (p.m_track == n)
      return &p;
  }

  return NULL;  // no matching track number found
}